

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O0

string * __thiscall FilenameBuilder::build(FilenameBuilder *this,string *pattern,string *extension)

{
  ulong uVar1;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string *out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  allocator *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  string *__lhs;
  allocator local_159;
  string local_158 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  AWIPS *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [24];
  timespec in_stack_ffffffffffffff40;
  string local_98 [32];
  string local_78 [32];
  string local_58 [55];
  undefined1 local_21;
  
  local_21 = 0;
  __lhs = in_RDI;
  std::__cxx11::string::string((string *)in_RDI,in_RDX);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::string::operator=((string *)__lhs,"{filename}");
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(__lhs,(char *)in_RSI);
    std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    std::__cxx11::string::operator=((string *)__lhs,local_58);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_78);
  }
  else {
    std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    std::__cxx11::string::operator=((string *)__lhs,local_98);
    std::__cxx11::string::~string(local_98);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(__lhs,(char *)in_RSI);
    std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    std::__cxx11::string::operator=((string *)__lhs,(string *)&stack0xffffffffffffff48);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    std::__cxx11::string::~string(local_d8);
  }
  paVar2 = &local_f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"%t",paVar2);
  (anonymous_namespace)::toISO8601_abi_cxx11_(in_stack_ffffffffffffff40);
  anon_unknown.dwarf_45453::replace(in_RSI,in_RDI,in_RCX);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  paVar2 = &local_159;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"{filename}",paVar2);
  anon_unknown.dwarf_45453::replace(in_RSI,in_RDI,in_RCX);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  anon_unknown.dwarf_45453::replace(in_stack_fffffffffffffee0,(timespec *)in_stack_fffffffffffffed8)
  ;
  anon_unknown.dwarf_45453::replace(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  anon_unknown.dwarf_45453::replace(in_stack_fffffffffffffee0,(Product *)in_stack_fffffffffffffed8);
  anon_unknown.dwarf_45453::replace(in_stack_fffffffffffffee0,(Region *)in_stack_fffffffffffffed8);
  anon_unknown.dwarf_45453::replace(in_stack_fffffffffffffee0,(Channel *)in_stack_fffffffffffffed8);
  return in_RDI;
}

Assistant:

std::string FilenameBuilder::build(
    const std::string& pattern,
    const std::string extension) const {
  std::string out = pattern;

  // Default pattern to passing through the original filename
  if (out.empty()) {
    out = "{filename}";
  }

  // Prefix directory if set
  if (!dir.empty()) {
    out = dir + "/" + out;
  } else {
    out = "./" + out;
  }

  // Append extension if set
  if (!extension.empty()) {
    out = out + "." + extension;
  }

  // %t: Date and time (ISO 8601)
  replace(out, "%t", toISO8601(time));

  // Replace {filename}
  replace(out, "{filename}", filename);

  // Replace {time:FORMAT}
  replace(out, time);

  // Replace {awips:XXX}
  replace(out, awips);

  // Replace {product:XXX}
  replace(out, product);

  // Replace {region:XXX}
  replace(out, region);

  // Replace {channel:XXX}
  replace(out, channel);

  return out;
}